

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t hex_str_to_int(char *s)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  
  wVar2 = L'\0';
  do {
    cVar1 = *s;
    iVar3 = (int)cVar1;
    if (cVar1 == '\0') {
      return wVar2;
    }
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar3 = iVar3 + -0x30;
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      iVar3 = iVar3 + -0x37;
    }
    else {
      if (5 < (byte)(cVar1 + 0x9fU)) {
        return L'\xffffffff';
      }
      iVar3 = iVar3 + -0x57;
    }
    wVar2 = wVar2 * 0x10 + iVar3;
    s = s + 1;
  } while (iVar3 != -1);
  return L'\xffffffff';
}

Assistant:

int hex_str_to_int(const char *s) {
	int result = 0;
	while (*s) {
		int current = hex_char_to_int(*s);
		if (current == -1)
			return -1;
		result *= 16;
		result += current;
		++s;
	}
	return result;
}